

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall Runtime::setVar(Runtime *this,string *name,Data *data)

{
  Data *pDVar1;
  long local_38;
  Data *target;
  Data *data_local;
  string *name_local;
  Runtime *this_local;
  
  pDVar1 = getVar(this,name);
  if (pDVar1 == (Data *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(pDVar1,&Data::typeinfo,&Integer::typeinfo,0);
  }
  if (local_38 != 0) {
    pDVar1[1]._vptr_Data = data[1]._vptr_Data;
  }
  return;
}

Assistant:

void Runtime::setVar(std::string &name, Data *data) {
    auto target = getVar(name);
    if ((dynamic_cast<Integer *>(target)) != NULL) {
        ((Integer *) target)->value = ((Integer *) data)->value;
    }
}